

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SGDOptimizer::SGDOptimizer(SGDOptimizer *this,SGDOptimizer *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  Int64Parameter *this_01;
  DoubleParameter *pDVar2;
  SGDOptimizer *from_local;
  SGDOptimizer *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SGDOptimizer_00d5b438;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_learningrate(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->learningrate_);
    this->learningrate_ = pDVar2;
  }
  else {
    this->learningrate_ = (DoubleParameter *)0x0;
  }
  bVar1 = has_minibatchsize(from);
  if (bVar1) {
    this_01 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_01,from->minibatchsize_);
    this->minibatchsize_ = this_01;
  }
  else {
    this->minibatchsize_ = (Int64Parameter *)0x0;
  }
  bVar1 = has_momentum(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->momentum_);
    this->momentum_ = pDVar2;
  }
  else {
    this->momentum_ = (DoubleParameter *)0x0;
  }
  return;
}

Assistant:

SGDOptimizer::SGDOptimizer(const SGDOptimizer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_learningrate()) {
    learningrate_ = new ::CoreML::Specification::DoubleParameter(*from.learningrate_);
  } else {
    learningrate_ = NULL;
  }
  if (from.has_minibatchsize()) {
    minibatchsize_ = new ::CoreML::Specification::Int64Parameter(*from.minibatchsize_);
  } else {
    minibatchsize_ = NULL;
  }
  if (from.has_momentum()) {
    momentum_ = new ::CoreML::Specification::DoubleParameter(*from.momentum_);
  } else {
    momentum_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SGDOptimizer)
}